

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O2

void dwt_calc_explicit_stepsizes(opj_tccp_t *tccp,int prec)

{
  OPJ_UINT32 OVar1;
  int iVar2;
  int l;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  double dVar9;
  
  OVar1 = tccp->numresolutions;
  uVar7 = OVar1 * 3 - 2;
  if ((int)uVar7 < 1) {
    uVar7 = 0;
  }
  for (uVar8 = 0; uVar8 != uVar7; uVar8 = uVar8 + 1) {
    if (uVar8 == 0) {
      uVar4 = 0;
      iVar3 = 0;
    }
    else {
      iVar3 = (int)uVar8 + -1;
      uVar4 = ~(iVar3 / 3);
      iVar3 = iVar3 % 3 + 1;
    }
    iVar2 = 2 - (uint)(iVar3 - 1U < 2);
    if (iVar3 == 0) {
      iVar2 = 0;
    }
    if (tccp->qmfbid == 0) {
      iVar2 = 0;
    }
    dVar9 = 8192.0;
    if (tccp->qntsty != 0) {
      dVar9 = (double)(0x2000 << ((byte)iVar2 & 0x1f)) /
              dwt_norms_real[iVar3][(int)(uVar4 + (OVar1 - 1))];
    }
    dVar9 = floor(dVar9);
    uVar5 = 0;
    uVar6 = (uint)dVar9;
    for (uVar4 = uVar6; 1 < (int)uVar4; uVar4 = uVar4 >> 1) {
      uVar5 = uVar5 + 1;
    }
    uVar4 = uVar6 << (0xbU - (char)uVar5 & 0x1f);
    if (0xb < uVar5) {
      uVar4 = (int)uVar6 >> ((char)uVar5 - 0xbU & 0x1f);
    }
    tccp->stepsizes[uVar8].mant = uVar4 & 0x7ff;
    tccp->stepsizes[uVar8].expn = (iVar2 + prec + 0xd) - uVar5;
  }
  return;
}

Assistant:

void dwt_calc_explicit_stepsizes(opj_tccp_t * tccp, int prec) {
	int numbands, bandno;
	numbands = 3 * tccp->numresolutions - 2;
	for (bandno = 0; bandno < numbands; bandno++) {
		double stepsize;
		int resno, level, orient, gain;

		resno = (bandno == 0) ? 0 : ((bandno - 1) / 3 + 1);
		orient = (bandno == 0) ? 0 : ((bandno - 1) % 3 + 1);
		level = tccp->numresolutions - 1 - resno;
		gain = (tccp->qmfbid == 0) ? 0 : ((orient == 0) ? 0 : (((orient == 1) || (orient == 2)) ? 1 : 2));
		if (tccp->qntsty == J2K_CCP_QNTSTY_NOQNT) {
			stepsize = 1.0;
		} else {
			double norm = dwt_norms_real[orient][level];
			stepsize = (1 << (gain)) / norm;
		}
		dwt_encode_stepsize((int) floor(stepsize * 8192.0), prec + gain, &tccp->stepsizes[bandno]);
	}
}